

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O0

void __thiscall trng::yarn3s::jump(yarn3s *this,unsigned_long_long s)

{
  ulong in_RSI;
  yarn3s *in_RDI;
  uint i_1;
  uint i;
  uint in_stack_0000005c;
  yarn3s *in_stack_00000060;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  if (in_RSI < 0x10) {
    for (local_14 = 0; local_14 < in_RSI; local_14 = local_14 + 1) {
      step(in_RDI);
    }
  }
  else {
    for (; local_10 != 0; local_10 = local_10 >> 1) {
      if ((local_10 & 1) == 1) {
        jump2(in_stack_00000060,in_stack_0000005c);
      }
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3s::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      unsigned int i(0);
      while (s > 0) {
        if (s % 2 == 1)
          jump2(i);
        ++i;
        s >>= 1u;
      }
    }
  }